

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_output(ikcpcb *kcp,void *data,int size)

{
  int iVar1;
  int size_local;
  void *data_local;
  ikcpcb *kcp_local;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0xce,"int ikcp_output(ikcpcb *, const void *, int)");
  }
  if (kcp->output != (_func_int_char_ptr_int_IKCPCB_ptr_void_ptr *)0x0) {
    iVar1 = ikcp_canlog(kcp,1);
    if (iVar1 != 0) {
      ikcp_log(kcp,1,"[RO] %ld bytes",(long)size);
    }
    if (size == 0) {
      kcp_local._4_4_ = 0;
    }
    else {
      kcp_local._4_4_ = (*kcp->output)((char *)data,size,kcp,kcp->user);
    }
    return kcp_local._4_4_;
  }
  __assert_fail("kcp->output",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                ,0xcf,"int ikcp_output(ikcpcb *, const void *, int)");
}

Assistant:

static int ikcp_output(ikcpcb *kcp, const void *data, int size)
{
	assert(kcp);
	assert(kcp->output);
	if (ikcp_canlog(kcp, IKCP_LOG_OUTPUT)) {
		ikcp_log(kcp, IKCP_LOG_OUTPUT, "[RO] %ld bytes", (long)size);
	}
	if (size == 0) return 0;
	return kcp->output((const char*)data, size, kcp, kcp->user);
}